

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O0

void llb_build_value_get_stale_file_list
               (llb_build_value *value,void *context,_func_void_void_ptr_llb_data_t *iterator)

{
  bool bVar1;
  BuildValue *this;
  reference pSVar2;
  char *__s;
  string local_98;
  undefined1 local_78 [8];
  llb_data_t data;
  StringRef string;
  iterator __end1;
  iterator __begin1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> stringList;
  _func_void_void_ptr_llb_data_t *iterator_local;
  void *context_local;
  llb_build_value *value_local;
  
  stringList.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)iterator;
  this = anon_unknown.dwarf_1efc24::CAPIBuildValue::getInternalBuildValue((CAPIBuildValue *)value);
  llbuild::buildsystem::BuildValue::getStaleFileList
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__range1,this);
  __end1 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                     ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__range1);
  string.Length =
       (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                         ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                *)&string.Length);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
             ::operator*(&__end1);
    data.data = (uint8_t *)pSVar2->Data;
    local_78 = (undefined1  [8])pSVar2->Length;
    string.Data = (char *)local_78;
    llvm::StringRef::str_abi_cxx11_(&local_98,(StringRef *)&data.data);
    __s = (char *)std::__cxx11::string::c_str();
    data.length = (uint64_t)strdup(__s);
    std::__cxx11::string::~string((string *)&local_98);
    (*(code *)stringList.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(context,local_78,data.length);
    llb_data_destroy((llb_data_t *)local_78);
    __gnu_cxx::
    __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
    ::operator++(&__end1);
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__range1);
  return;
}

Assistant:

void llb_build_value_get_stale_file_list(llb_build_value *_Nonnull value, void *_Nullable context, void(*_Nonnull iterator)(void *_Nullable context, llb_data_t data)) {
  auto stringList = ((CAPIBuildValue *)value)->getInternalBuildValue().getStaleFileList();
  for (auto string: stringList) {
    llb_data_t data;
    data.length = string.size();
    data.data = (uint8_t *)strdup(string.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}